

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf.cpp
# Opt level: O3

maybe<char32_t,_void> * __thiscall
pstore::utf::utf8_decoder::get
          (maybe<char32_t,_void> *__return_storage_ptr__,utf8_decoder *this,uint8_t byte)

{
  anon_struct_4_0_00000001_for___align aVar1;
  uint8_t uVar2;
  undefined7 in_register_00000011;
  not_null<char32_t_*> local_38;
  not_null<unsigned_char_*> local_30;
  
  local_30.ptr_ = &this->state_;
  gsl::not_null<unsigned_char_*>::ensure_invariant(&local_30);
  local_38.ptr_ = &this->codepoint_;
  gsl::not_null<char32_t_*>::ensure_invariant(&local_38);
  uVar2 = decode(local_30,local_38,(uint32_t)CONCAT71(in_register_00000011,byte));
  if (uVar2 == '\0') {
    aVar1 = (anon_struct_4_0_00000001_for___align)this->codepoint_;
    this->codepoint_ = L'\0';
    __return_storage_ptr__->valid_ = true;
    (__return_storage_ptr__->storage_).__align = aVar1;
  }
  else {
    __return_storage_ptr__->valid_ = false;
    *(undefined3 *)&__return_storage_ptr__->field_0x1 = 0;
    __return_storage_ptr__->storage_ = (type)0x0;
  }
  this->well_formed_ = uVar2 == '\0';
  return __return_storage_ptr__;
}

Assistant:

auto utf8_decoder::get (std::uint8_t const byte) noexcept -> maybe<char32_t> {
            if (decode (&state_, &codepoint_, byte) != 0U) {
                well_formed_ = false;
                return nothing<char32_t> ();
            }
            auto const res = codepoint_;
            well_formed_ = true;
            codepoint_ = 0;
            return just (res);
        }